

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall CMU462::StaticScene::BVHAccel::~BVHAccel(BVHAccel *this)

{
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00280e58;
  delete_tree(this,this->root);
  puts("BVH deleted!");
  Aggregate::~Aggregate(&this->super_Aggregate);
  return;
}

Assistant:

BVHAccel::~BVHAccel() {
		// TODO (PathTracer):
		// Implement a proper destructor for your BVH accelerator aggregate
		delete_tree(root);
		printf("BVH deleted!\n");
	}